

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::StringConst::StringConst(StringConst *this,string *value,uint32_t width)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_type sVar7;
  VarException *this_00;
  byte bVar8;
  ulong value_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  StringConst *local_80;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  string local_58;
  allocator_type local_31;
  
  sVar7 = value->_M_string_length;
  if (sVar7 == 0) {
    value_00 = 0;
  }
  else {
    value_00 = 0;
    bVar8 = 0;
    do {
      value_00 = value_00 | (long)(value->_M_dataplus)._M_p[sVar7 - 1] << (bVar8 & 0x3f);
      bVar8 = bVar8 + 8;
      sVar7 = sVar7 - 1;
    } while (sVar7 != 0);
  }
  Const::Const(&this->super_Const,value_00,width,false);
  (this->super_Const).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b4568;
  paVar2 = &(this->value_).field_2;
  (this->value_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (value->_M_dataplus)._M_p;
  paVar1 = &value->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined4 *)((long)&value->field_2 + 4);
    uVar5 = *(undefined4 *)((long)&value->field_2 + 8);
    uVar6 = *(undefined4 *)((long)&value->field_2 + 0xc);
    *(undefined4 *)paVar2 = *(undefined4 *)paVar1;
    *(undefined4 *)((long)&(this->value_).field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->value_).field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->value_).field_2 + 0xc) = uVar6;
  }
  else {
    (this->value_)._M_dataplus._M_p = pcVar3;
    (this->value_).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->value_)._M_string_length = value->_M_string_length;
  (value->_M_dataplus)._M_p = (pointer)paVar1;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  if ((pointer)(ulong)width < (pointer)((this->value_)._M_string_length << 3)) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)(value->_M_dataplus)._M_p;
    local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)value->_M_string_length;
    format_str.size_ = 0x2d;
    format_str.data_ = (char *)0x2d;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_78;
    local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)width;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_58,(detail *)"{0} is too big for constant with bit size {0}",format_str,args);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_80;
    local_80 = this;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_78,__l,&local_31);
    VarException::VarException(this_00,&local_58,&local_78);
    __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

StringConst::StringConst(std::string value, uint32_t width)
    : Const(convert_string_to_int(value), width, false), value_(std::move(value)) {
    auto const min_size = value_.size() * 8u;
    if (min_size > width)
        throw VarException(::format("{0} is too big for constant with bit size {0}", value, width),
                           {this});
}